

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_layout_row_template_end(nk_context *ctx)

{
  int iVar1;
  nk_panel *pnVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  nk_vec2 nVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x457d,"void nk_layout_row_template_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x457e,"void nk_layout_row_template_end(struct nk_context *)");
  }
  pnVar2 = ctx->current->layout;
  if (pnVar2 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x457f,"void nk_layout_row_template_end(struct nk_context *)");
  }
  if ((pnVar2->row).type == NK_LAYOUT_TEMPLATE) {
    iVar1 = (pnVar2->row).columns;
    lVar6 = (long)iVar1;
    if (0 < lVar6) {
      lVar3 = 0;
      iVar7 = 0;
      iVar5 = 0;
      fVar10 = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      do {
        fVar8 = (pnVar2->row).templates[lVar3];
        if (0.0 <= fVar8) {
          fVar12 = fVar12 + fVar8;
          fVar13 = fVar13 + fVar8;
        }
        else if (-1.0 <= fVar8) {
          iVar5 = iVar5 + 1;
          iVar7 = iVar7 + 1;
        }
        else {
          fVar12 = fVar12 - fVar8;
          fVar11 = -fVar8;
          if (-fVar8 <= fVar10) {
            fVar11 = fVar10;
          }
          iVar7 = iVar7 + 1;
          fVar10 = fVar11;
        }
        lVar3 = lVar3 + 1;
      } while (lVar6 != lVar3);
      if (iVar7 != 0) {
        iVar4 = 1;
        if (1 < iVar1) {
          iVar4 = iVar1;
        }
        fVar8 = (pnVar2->bounds).w;
        fVar11 = (ctx->style).window.spacing.x;
        nVar9 = nk_panel_get_padding(&ctx->style,pnVar2->type);
        fVar11 = (fVar8 - (nVar9.x + nVar9.x)) - (float)(iVar4 + -1) * fVar11;
        fVar13 = fVar11 - fVar13;
        fVar8 = 0.0;
        if (0.0 <= fVar13) {
          fVar8 = fVar13;
        }
        fVar8 = fVar8 / (float)iVar7;
        fVar13 = fVar8;
        if (fVar8 < fVar10) {
          fVar11 = fVar11 - fVar12;
          fVar13 = 0.0;
          if (0.0 <= fVar11) {
            fVar13 = fVar11;
          }
          fVar13 = fVar13 / (float)iVar5;
        }
        if (0 < iVar1) {
          lVar3 = 0;
          do {
            fVar12 = (pnVar2->row).templates[lVar3];
            fVar11 = fVar12;
            if (((fVar12 < 0.0) && (fVar11 = fVar13, fVar8 < fVar10)) && (fVar12 < -1.0)) {
              fVar11 = -fVar12;
            }
            (pnVar2->row).templates[lVar3] = fVar11;
            lVar3 = lVar3 + 1;
          } while (lVar6 != lVar3);
        }
      }
    }
    return;
  }
  __assert_fail("layout->row.type == NK_LAYOUT_TEMPLATE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x4585,"void nk_layout_row_template_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_layout_row_template_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;

    int i = 0;
    int variable_count = 0;
    int min_variable_count = 0;
    float min_fixed_width = 0.0f;
    float total_fixed_width = 0.0f;
    float max_variable_width = 0.0f;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    NK_ASSERT(layout->row.type == NK_LAYOUT_TEMPLATE);
    if (layout->row.type != NK_LAYOUT_TEMPLATE) return;
    for (i = 0; i < layout->row.columns; ++i) {
        float width = layout->row.templates[i];
        if (width >= 0.0f) {
            total_fixed_width += width;
            min_fixed_width += width;
        } else if (width < -1.0f) {
            width = -width;
            total_fixed_width += width;
            max_variable_width = NK_MAX(max_variable_width, width);
            variable_count++;
        } else {
            min_variable_count++;
            variable_count++;
        }
    }
    if (variable_count) {
        float space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
                            layout->bounds.w, layout->row.columns);
        float var_width = (NK_MAX(space-min_fixed_width,0.0f)) / (float)variable_count;
        int enough_space = var_width >= max_variable_width;
        if (!enough_space)
            var_width = (NK_MAX(space-total_fixed_width,0)) / (float)min_variable_count;
        for (i = 0; i < layout->row.columns; ++i) {
            float *width = &layout->row.templates[i];
            *width = (*width >= 0.0f)? *width: (*width < -1.0f && !enough_space)? -(*width): var_width;
        }
    }
}